

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O0

Quat<float> __thiscall Imath_3_2::Quat<float>::inverse(Quat<float> *this)

{
  Quat<float> *in_RSI;
  Vec3<float> *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 uVar2;
  undefined8 uVar1;
  Vec3<float> VVar3;
  Quat<float> QVar4;
  float qdot;
  undefined4 in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  
  uVar2 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  operator^(in_RSI,(Quat<float> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  Vec3<float>::operator-
            ((Vec3<float> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  VVar3 = Vec3<float>::operator/(in_RDI,(float)((ulong)in_RSI >> 0x20));
  uVar1 = CONCAT44(uVar2,VVar3.z);
  Quat(in_RSI,in_stack_ffffffffffffffac,(Vec3<float> *)0x19a8a0);
  QVar4.v.y = (float)(int)uVar1;
  QVar4.v.z = (float)(int)((ulong)uVar1 >> 0x20);
  QVar4.r = (float)(int)extraout_XMM0_Qa;
  QVar4.v.x = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return QVar4;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Quat<T>
                 Quat<T>::inverse () const IMATH_NOEXCEPT
{
    //
    // 1    Q*
    // - = ----   where Q* is conjugate (operator~)
    // Q   Q* Q   and (Q* Q) == Q ^ Q (4D dot)
    //

    T qdot = *this ^ *this;
    return Quat (r / qdot, -v / qdot);
}